

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateBinaryOp(ExpressionContext *ctx,SynBase *source,SynBinaryOpType op,ExprBase *lhs,ExprBase *rhs
              )

{
  long lVar1;
  SynBase *pSVar2;
  ScopeData *pSVar3;
  TypeBase *type;
  IntrusiveList<TypeHandle> arguments;
  bool bVar4;
  int iVar5;
  ExprBase *pEVar6;
  undefined4 extraout_var;
  TypeStruct *pTVar7;
  undefined4 extraout_var_00;
  TypeFunction *pTVar8;
  undefined4 extraout_var_01;
  ExprBase *arg1;
  TypeBase *pTVar9;
  ScopeData *pSVar10;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSVar11;
  size_t sVar12;
  char *pcVar13;
  ExprError *pEVar14;
  TypeRef *type_00;
  undefined4 extraout_var_03;
  byte bVar15;
  char *pcVar16;
  TypeStruct *pTVar17;
  ScopeData *pSVar18;
  char *pcVar19;
  byte bVar20;
  TypeStruct *type_01;
  ScopeData *pSVar21;
  uint uVar22;
  uint uVar23;
  TypeRef *rhsTypeRef;
  bool bVar24;
  bool bVar25;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  IntrusiveList<TypeHandle> types;
  TypeHandle *node;
  undefined4 extraout_var_02;
  
  type_01 = (TypeStruct *)lhs->type;
  if (((type_01 != (TypeStruct *)0x0) && ((type_01->super_TypeBase).typeID == 0)) ||
     ((pTVar17 = (TypeStruct *)rhs->type, pTVar17 != (TypeStruct *)0x0 &&
      ((pTVar17->super_TypeBase).typeID == 0)))) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar6->typeID = 0x14;
    pEVar6->source = source;
    pEVar6->type = pTVar9;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240bd0;
    *(SynBinaryOpType *)&pEVar6->field_0x2c = op;
    pEVar6[1]._vptr_ExprBase = (_func_int **)lhs;
    *(ExprBase **)&pEVar6[1].typeID = rhs;
    return pEVar6;
  }
  if (op == SYN_BINARY_OP_IN) {
    pcVar19 = "in";
    pcVar16 = "";
    bVar24 = false;
    goto LAB_00159d57;
  }
  if (op - SYN_BINARY_OP_EQUAL < 2) {
    if (type_01 != pTVar17) {
      pTVar7 = (TypeStruct *)ctx->typeNullPtr;
      if (type_01 == pTVar7) {
        lhs = CreateCast(ctx,source,lhs,(TypeBase *)pTVar17,false);
        pTVar17 = (TypeStruct *)rhs->type;
        pTVar7 = (TypeStruct *)ctx->typeNullPtr;
      }
      if (pTVar17 == pTVar7) {
        rhs = CreateCast(ctx,source,rhs,lhs->type,false);
      }
    }
    type_01 = (TypeStruct *)lhs->type;
    if ((type_01 == ctx->typeAutoRef) && (type_01 == (TypeStruct *)rhs->type)) {
      pcVar19 = "__rncomp";
      if (op == SYN_BINARY_OP_EQUAL) {
        pcVar19 = "__rcomp";
      }
      lVar1 = (long)pcVar19 - (ulong)(op == SYN_BINARY_OP_EQUAL);
LAB_0015a1d6:
      pcVar16 = (char *)(lVar1 + 8);
      bVar24 = true;
LAB_00159d57:
      name.end = pcVar16;
      name.begin = pcVar19;
      pEVar6 = CreateFunctionCall2(ctx,source,name,lhs,rhs,false,bVar24,bVar24);
      return pEVar6;
    }
    if (type_01 != (TypeStruct *)0x0) {
      uVar22 = (type_01->super_TypeBase).typeID;
      if (uVar22 == 0x14) {
        if (type_01 == (TypeStruct *)rhs->type) {
          pcVar16 = GetOpName(op);
          sVar12 = strlen(pcVar16);
          name_02.end = pcVar16 + sVar12;
          name_02.begin = pcVar16;
          pEVar6 = CreateFunctionCall2(ctx,source,name_02,lhs,rhs,true,false,true);
          if (pEVar6 != (ExprBase *)0x0) {
            return pEVar6;
          }
          pcVar19 = "__ancomp";
          if (op == SYN_BINARY_OP_EQUAL) {
            pcVar19 = "__acomp";
          }
          lVar1 = (long)pcVar19 - (ulong)(op == SYN_BINARY_OP_EQUAL);
          goto LAB_0015a1d6;
        }
      }
      else if ((uVar22 == 0x15) && (type_01 == (TypeStruct *)rhs->type)) {
        types.head = (TypeHandle *)0x0;
        types.tail = (TypeHandle *)0x0;
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        node = (TypeHandle *)CONCAT44(extraout_var_00,iVar5);
        node->type = ctx->typeInt;
        node->next = (TypeHandle *)0x0;
        node->listed = false;
        IntrusiveList<TypeHandle>::push_back(&types,node);
        arguments.tail = types.tail;
        arguments.head = types.head;
        pTVar8 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
        pSVar2 = lhs->source;
        pEVar6->typeID = 0x12;
        pEVar6->source = pSVar2;
        pEVar6->type = &pTVar8->super_TypeBase;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002409d8;
        pEVar6[1]._vptr_ExprBase = (_func_int **)lhs;
        pEVar6[1].typeID = 0xd;
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        arg1 = (ExprBase *)CONCAT44(extraout_var_02,iVar5);
        pSVar2 = rhs->source;
        arg1->next = (ExprBase *)0x0;
        arg1->typeID = 0x12;
        arg1->source = pSVar2;
        arg1->type = &pTVar8->super_TypeBase;
        arg1->listed = false;
        arg1->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002409d8;
        arg1[1]._vptr_ExprBase = (_func_int **)rhs;
        arg1[1].typeID = 0xd;
        pcVar16 = "__pncomp";
        if (op == SYN_BINARY_OP_EQUAL) {
          pcVar16 = "__pcomp";
        }
        name_00.end = pcVar16 + (8 - (ulong)(op == SYN_BINARY_OP_EQUAL));
        name_00.begin = pcVar16;
        pEVar6 = CreateFunctionCall2(ctx,source,name_00,pEVar6,arg1,false,true,true);
        return pEVar6;
      }
    }
    if (type_01 == (TypeStruct *)ctx->typeTypeID) {
      bVar24 = (TypeStruct *)rhs->type == type_01;
      bVar15 = 0;
    }
    else {
      bVar15 = 0;
      bVar24 = false;
    }
  }
  else {
    if (op == SYN_BINARY_OP_LOGICAL_XOR) {
      if ((type_01 != (TypeStruct *)0x0) && ((type_01->super_TypeBase).typeID == 0x18)) {
        pcVar16 = GetOpName(SYN_BINARY_OP_LOGICAL_XOR);
        sVar12 = strlen(pcVar16);
        name_01.end = pcVar16 + sVar12;
        name_01.begin = pcVar16;
        pEVar6 = CreateFunctionCall2(ctx,source,name_01,lhs,rhs,true,false,true);
        if (pEVar6 != (ExprBase *)0x0) {
          return pEVar6;
        }
      }
LAB_00159ff5:
      lhs = CreateConditionCast(ctx,lhs->source,lhs);
      rhs = CreateConditionCast(ctx,rhs->source,rhs);
      type_01 = (TypeStruct *)lhs->type;
      bVar15 = 1;
    }
    else {
      if (op - SYN_BINARY_OP_LOGICAL_AND < 3) goto LAB_00159ff5;
      bVar15 = 0;
    }
    bVar24 = false;
  }
  if (type_01 == (TypeStruct *)ctx->typeVoid) {
    pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar16 = "ERROR: first operand type is \'void\'";
LAB_0015a0ae:
    pEVar14 = anon_unknown.dwarf_b837c::ReportExpected(ctx,source,pTVar9,pcVar16);
    return &pEVar14->super_ExprBase;
  }
  pTVar17 = (TypeStruct *)rhs->type;
  if (pTVar17 == (TypeStruct *)ctx->typeVoid) {
    pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar16 = "ERROR: second operand type is \'void\'";
    goto LAB_0015a0ae;
  }
  bVar4 = ExpressionContext::IsNumericType(ctx,&type_01->super_TypeBase);
  if (bVar4) {
    bVar4 = ExpressionContext::IsNumericType(ctx,(TypeBase *)pTVar17);
  }
  else {
    bVar4 = false;
  }
  if ((type_01 == (TypeStruct *)0x0) || ((type_01->super_TypeBase).typeID != 0x19)) {
    bVar25 = false;
  }
  else {
    bVar25 = type_01 == pTVar17;
  }
  bVar20 = bVar25 | bVar4;
  if (op - SYN_BINARY_OP_EQUAL < 2) {
    if ((TypeStruct *)ctx->typeTypeID == pTVar17 && type_01 == (TypeStruct *)ctx->typeTypeID) {
      bVar20 = 1;
    }
    if (type_01 == (TypeStruct *)0x0) goto LAB_0015a263;
    pSVar21 = (ScopeData *)0x0;
    if ((pTVar17 != (TypeStruct *)0x0) && ((type_01->super_TypeBase).typeID == 0x12)) {
      if ((pTVar17->super_TypeBase).typeID == 0x12) {
        if (type_01 == pTVar17) {
          bVar20 = 1;
        }
        else {
          pSVar21 = type_01->typeScope;
          if ((((pSVar21 != (ScopeData *)0x0) && (pSVar21->uniqueId == 0x18)) &&
              (pSVar3 = pTVar17->typeScope, pSVar3 != (ScopeData *)0x0)) &&
             (pSVar3->uniqueId == 0x18)) {
            do {
              pSVar18 = pSVar21;
              pSVar21 = (ScopeData *)(pSVar18->scopes).allocator;
            } while (pSVar21 != (ScopeData *)0x0);
            do {
              pSVar10 = pSVar3;
              pSVar3 = (ScopeData *)(pSVar10->scopes).allocator;
            } while (pSVar3 != (ScopeData *)0x0);
            pSVar21 = (ScopeData *)0x0;
            if (pSVar18 == pSVar10) {
              bVar20 = 1;
              pSVar21 = pSVar18;
            }
            goto LAB_0015a265;
          }
        }
      }
      goto LAB_0015a263;
    }
  }
  else {
LAB_0015a263:
    pSVar21 = (ScopeData *)0x0;
  }
LAB_0015a265:
  if (bVar24) {
    AssertValueExpression(ctx,lhs->source,lhs);
    AssertValueExpression(ctx,rhs->source,rhs);
    if (bVar20 == 0) {
LAB_0015a423:
      pTVar9 = lhs->type;
      pcVar13 = GetOpName(op);
      pcVar16 = (lhs->type->name).begin;
      pcVar19 = (rhs->type->name).begin;
      pEVar14 = anon_unknown.dwarf_b837c::ReportExpected
                          (ctx,source,pTVar9,
                           "ERROR: operation %s is not supported on \'%.*s\' and \'%.*s\'",pcVar13,
                           (ulong)(uint)(*(int *)&(lhs->type->name).end - (int)pcVar16),pcVar16,
                           (ulong)(uint)(*(int *)&(rhs->type->name).end - (int)pcVar19),pcVar19);
      return &pEVar14->super_ExprBase;
    }
  }
  else {
    if (bVar20 == 0) {
      pcVar16 = GetOpName(op);
      sVar12 = strlen(pcVar16);
      name_04.end = pcVar16 + sVar12;
      name_04.begin = pcVar16;
      pEVar6 = CreateFunctionCall2(ctx,source,name_04,lhs,rhs,false,false,true);
      if (pEVar6 != (ExprBase *)0x0) {
        return pEVar6;
      }
      AssertValueExpression(ctx,lhs->source,lhs);
      AssertValueExpression(ctx,rhs->source,rhs);
      goto LAB_0015a423;
    }
    types.head = (TypeHandle *)type_01;
    types.tail = (TypeHandle *)pTVar17;
    pSVar11 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::operator[]
                        (&ctx->noBinaryOperatorForTypePair,op - SYN_BINARY_OP_ADD);
    bVar24 = SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains(pSVar11,(TypePair *)&types);
    if (!bVar24) {
      pcVar16 = GetOpName(op);
      sVar12 = strlen(pcVar16);
      name_03.end = pcVar16 + sVar12;
      name_03.begin = pcVar16;
      pEVar6 = CreateFunctionCall2(ctx,source,name_03,lhs,rhs,true,false,true);
      if (pEVar6 != (ExprBase *)0x0) {
        return pEVar6;
      }
      pSVar11 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::operator[]
                          (&ctx->noBinaryOperatorForTypePair,op - SYN_BINARY_OP_ADD);
      SmallDenseSet<TypePair,_TypePairHasher,_4U>::insert(pSVar11,(TypePair *)&types);
    }
    AssertValueExpression(ctx,lhs->source,lhs);
    AssertValueExpression(ctx,rhs->source,rhs);
  }
  bVar20 = (byte)(0x38180 >> ((byte)op & 0x1f)) & op < SYN_BINARY_OP_LOGICAL_AND;
  pTVar9 = lhs->type;
  if (ctx->typeDouble == pTVar9 || ctx->typeFloat == pTVar9) {
    if ((bVar15 | bVar20) != 1) {
LAB_0015a4e5:
      if (bVar15 == 0) {
        bVar24 = ExpressionContext::IsNumericType(ctx,pTVar9);
        if (bVar24) {
          type = rhs->type;
          bVar24 = ExpressionContext::IsNumericType(ctx,type);
          if (!bVar24) goto LAB_0015a549;
          type_00 = (TypeRef *)ExpressionContext::GetBinaryOpResultType(ctx,pTVar9,type);
LAB_0015a55b:
          lhs = CreateCast(ctx,source,lhs,&type_00->super_TypeBase,false);
          goto LAB_0015a57d;
        }
LAB_0015a549:
        if (pSVar21 != (ScopeData *)0x0) {
          type_00 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pSVar21);
          goto LAB_0015a55b;
        }
      }
      else {
        lhs = CreateCast(ctx,source,lhs,ctx->typeBool,false);
        type_00 = (TypeRef *)ctx->typeBool;
LAB_0015a57d:
        rhs = CreateCast(ctx,source,rhs,&type_00->super_TypeBase,false);
      }
      pTVar9 = lhs->type;
      if (pTVar9 == rhs->type) {
        bVar24 = op - SYN_BINARY_OP_LESS < 6;
        if (bVar24 || bVar15 != 0) {
          pTVar9 = ctx->typeBool;
        }
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_03,iVar5);
        pEVar6->typeID = 0x14;
        pEVar6->source = source;
        pEVar6->type = pTVar9;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240bd0;
        *(SynBinaryOpType *)&pEVar6->field_0x2c = op;
        pEVar6[1]._vptr_ExprBase = (_func_int **)lhs;
        *(ExprBase **)&pEVar6[1].typeID = rhs;
        if ((bVar24 || bVar15 != 0) || (bVar20 != 0 || lhs->type != ctx->typeBool)) {
          return pEVar6;
        }
        pEVar6 = CreateCast(ctx,source,pEVar6,ctx->typeInt,false);
        return pEVar6;
      }
      pcVar13 = GetOpName(op);
      pcVar16 = (lhs->type->name).begin;
      uVar22 = *(int *)&(lhs->type->name).end - (int)pcVar16;
      pcVar19 = (rhs->type->name).begin;
      uVar23 = *(int *)&(rhs->type->name).end - (int)pcVar19;
      goto LAB_0015a5e6;
    }
  }
  else if (((bVar15 | bVar20) != 1) || (ctx->typeFloat != rhs->type && ctx->typeDouble != rhs->type)
          ) goto LAB_0015a4e5;
  pcVar13 = GetOpName(op);
  pcVar16 = (lhs->type->name).begin;
  uVar22 = *(int *)&(lhs->type->name).end - (int)pcVar16;
  pcVar19 = (rhs->type->name).begin;
  uVar23 = *(int *)&(rhs->type->name).end - (int)pcVar19;
LAB_0015a5e6:
  pEVar14 = anon_unknown.dwarf_b837c::ReportExpected
                      (ctx,source,pTVar9,
                       "ERROR: operation %s is not supported on \'%.*s\' and \'%.*s\'",pcVar13,
                       (ulong)uVar22,pcVar16,(ulong)uVar23,pcVar19);
  return &pEVar14->super_ExprBase;
}

Assistant:

ExprBase* CreateBinaryOp(ExpressionContext &ctx, SynBase *source, SynBinaryOpType op, ExprBase *lhs, ExprBase *rhs)
{
	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(source, ctx.GetErrorType(), op, lhs, rhs);

	if(op == SYN_BINARY_OP_IN)
		return CreateFunctionCall2(ctx, source, InplaceStr("in"), lhs, rhs, false, false, false);

	bool skipOverload = false;

	// Built-in comparisons
	if(op == SYN_BINARY_OP_EQUAL || op == SYN_BINARY_OP_NOT_EQUAL)
	{
		if(lhs->type != rhs->type)
		{
			if(lhs->type == ctx.typeNullPtr)
				lhs = CreateCast(ctx, source, lhs, rhs->type, false);

			if(rhs->type == ctx.typeNullPtr)
				rhs = CreateCast(ctx, source, rhs, lhs->type, false);
		}

		if(lhs->type == ctx.typeAutoRef && lhs->type == rhs->type)
		{
			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__rcomp" : "__rncomp"), lhs, rhs, false, true, true);
		}

		if(isType<TypeFunction>(lhs->type) && lhs->type == rhs->type)
		{
			IntrusiveList<TypeHandle> types;
			types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ctx.typeInt));
			TypeBase *type = ctx.GetFunctionType(source, ctx.typeVoid, types);

			lhs = new (ctx.get<ExprTypeCast>()) ExprTypeCast(lhs->source, type, lhs, EXPR_CAST_REINTERPRET);
			rhs = new (ctx.get<ExprTypeCast>()) ExprTypeCast(rhs->source, type, rhs, EXPR_CAST_REINTERPRET);

			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__pcomp" : "__pncomp"), lhs, rhs, false, true, true);
		}

		if(isType<TypeUnsizedArray>(lhs->type) && lhs->type == rhs->type)
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
				return result;

			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__acomp" : "__ancomp"), lhs, rhs, false, true, true);
		}

		if(lhs->type == ctx.typeTypeID && rhs->type == ctx.typeTypeID)
			skipOverload = true;
	}

	if(!skipOverload)
	{
		// For ^^ try to find a function before generic condition casts to bool
		if(op == SYN_BINARY_OP_LOGICAL_XOR && isType<TypeClass>(lhs->type))
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
				return result;
		}
	}

	// Promotion to bool for some types
	if(op == SYN_BINARY_OP_LOGICAL_AND || op == SYN_BINARY_OP_LOGICAL_OR || op == SYN_BINARY_OP_LOGICAL_XOR)
	{
		lhs = CreateConditionCast(ctx, lhs->source, lhs);
		rhs = CreateConditionCast(ctx, rhs->source, rhs);
	}

	if(lhs->type == ctx.typeVoid)
		return ReportExpected(ctx, source, ctx.GetErrorType(), "ERROR: first operand type is 'void'");

	if(rhs->type == ctx.typeVoid)
		return ReportExpected(ctx, source, ctx.GetErrorType(), "ERROR: second operand type is 'void'");

	bool hasBuiltIn = false;

	hasBuiltIn |= ctx.IsNumericType(lhs->type) && ctx.IsNumericType(rhs->type);
	hasBuiltIn |= isType<TypeEnum>(lhs->type) && lhs->type == rhs->type;

	TypeBase *commonBaseClass = NULL;

	if(op == SYN_BINARY_OP_EQUAL || op == SYN_BINARY_OP_NOT_EQUAL)
	{
		if(lhs->type == ctx.typeTypeID && rhs->type == ctx.typeTypeID)
			hasBuiltIn = true;

		if(isType<TypeRef>(lhs->type) && isType<TypeRef>(rhs->type))
		{
			TypeRef *lhsTypeRef = getType<TypeRef>(lhs->type);
			TypeRef *rhsTypeRef = getType<TypeRef>(rhs->type);

			if(lhs->type == rhs->type)
			{
				hasBuiltIn = true;
			}
			else if(isType<TypeClass>(lhsTypeRef->subType) && isType<TypeClass>(rhsTypeRef->subType))
			{
				TypeClass *lhsTypeClass = getType<TypeClass>(lhsTypeRef->subType);
				TypeClass *rhsTypeClass = getType<TypeClass>(rhsTypeRef->subType);

				while(lhsTypeClass->baseClass)
					lhsTypeClass = lhsTypeClass->baseClass;

				while(rhsTypeClass->baseClass)
					rhsTypeClass = rhsTypeClass->baseClass;

				if(lhsTypeClass == rhsTypeClass)
				{
					hasBuiltIn = true;

					commonBaseClass = lhsTypeClass;
				}
			}
		}
	}

	if(!skipOverload)
	{
		if(!hasBuiltIn)
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, false, false, true))
				return result;
		}
		else
		{
			TypePair typePair(lhs->type, rhs->type);

			if(!ctx.noBinaryOperatorForTypePair[int(op) - 1].contains(typePair))
			{
				if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
					return result;
				else
					ctx.noBinaryOperatorForTypePair[int(op) - 1].insert(typePair);
			}
		}
	}

	AssertValueExpression(ctx, lhs->source, lhs);
	AssertValueExpression(ctx, rhs->source, rhs);

	if(!hasBuiltIn)
		return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));

	bool binaryOp = IsBinaryOp(op);
	bool comparisonOp = IsComparisonOp(op);
	bool logicalOp = IsLogicalOp(op);

	if(ctx.IsFloatingPointType(lhs->type) || ctx.IsFloatingPointType(rhs->type))
	{
		if(logicalOp || binaryOp)
			return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));
	}

	if(logicalOp)
	{
		// Logical operations require both operands to be 'bool'
		lhs = CreateCast(ctx, source, lhs, ctx.typeBool, false);
		rhs = CreateCast(ctx, source, rhs, ctx.typeBool, false);
	}
	else if(ctx.IsNumericType(lhs->type) && ctx.IsNumericType(rhs->type))
	{
		// Numeric operations promote both operands to a common type
		TypeBase *commonType = ctx.GetBinaryOpResultType(lhs->type, rhs->type);

		lhs = CreateCast(ctx, source, lhs, commonType, false);
		rhs = CreateCast(ctx, source, rhs, commonType, false);
	}
	else if(commonBaseClass)
	{
		TypeBase *commonType = ctx.GetReferenceType(commonBaseClass);

		lhs = CreateCast(ctx, source, lhs, commonType, false);
		rhs = CreateCast(ctx, source, rhs, commonType, false);
	}

	if(lhs->type != rhs->type)
		return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));

	TypeBase *resultType = NULL;

	if(comparisonOp || logicalOp)
		resultType = ctx.typeBool;
	else
		resultType = lhs->type;

	ExprBase *result = new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(source, resultType, op, lhs, rhs);

	// Arithmetic operation on bool results in an int
	if(lhs->type == ctx.typeBool && !binaryOp && !comparisonOp && !logicalOp)
		return CreateCast(ctx, source, result, ctx.typeInt, false);

	return result;
}